

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O0

void __thiscall hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,UnaryExpression *expr)

{
  NotSupportedException *this_00;
  v9 *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string_view local_140 [2];
  v9 *local_120;
  char *local_118;
  string local_110;
  Expression *local_f0;
  Expression *op;
  UnaryExpression *expr_local;
  ExpressionPrinter *this_local;
  undefined1 local_c0 [16];
  v9 *local_b0;
  char *local_a8;
  string_view *local_a0;
  v9 *local_98;
  char *pcStack_90;
  string *local_88;
  char *local_80;
  v9 **local_78;
  v9 **local_70;
  v9 *local_68;
  char *pcStack_60;
  ExpressionPrinter **local_50;
  undefined1 *local_48;
  ExpressionPrinter **local_40;
  ExpressionPrinter **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  char *local_20;
  v9 **local_18;
  char *local_10;
  
  op = &expr->super_Expression;
  expr_local = (UnaryExpression *)this;
  local_f0 = slang::ast::UnaryExpression::operand(expr);
  this_01 = (v9 *)0x72d5b5;
  std::operator<<((ostream *)&this->field_0x18,"(");
  switch(op[1].kind) {
  case Invalid:
    std::operator<<((ostream *)&this->field_0x18,"+");
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(local_f0,this);
    break;
  case IntegerLiteral:
    std::operator<<((ostream *)&this->field_0x18,"-");
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(local_f0,this);
    break;
  case RealLiteral:
    std::operator<<((ostream *)&this->field_0x18,"~");
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(local_f0,this);
    break;
  default:
    this_00 = (NotSupportedException *)__cxa_allocate_exception(0x20);
    local_78 = &local_120;
    local_80 = "Unary type {0} not supported for hgdb";
    local_20 = "Unary type {0} not supported for hgdb";
    local_120 = (v9 *)0x6d4820;
    local_18 = local_78;
    local_118 = (char *)std::char_traits<char>::length("Unary type {0} not supported for hgdb");
    local_10 = local_80;
    local_140[0] = slang::ast::toString(op[1].kind);
    local_88 = &local_110;
    local_98 = local_120;
    pcStack_90 = local_118;
    local_a0 = local_140;
    local_70 = &local_98;
    local_b0 = local_120;
    local_a8 = local_118;
    local_68 = local_b0;
    pcStack_60 = local_a8;
    this_local = (ExpressionPrinter *)
                 ::fmt::v9::
                 make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&>
                           ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                             *)local_a0,this_01,
                            (basic_string_view<char,_std::char_traits<char>_> *)local_88);
    local_48 = local_c0;
    local_50 = &this_local;
    local_30 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_a8;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_50;
    local_40 = local_50;
    local_38 = local_50;
    local_28 = local_48;
    ::fmt::v9::vformat_abi_cxx11_(&local_110,local_b0,fmt,args);
    NotSupportedException::NotSupportedException(this_00,&local_110,*this->loc_);
    __cxa_throw(this_00,&NotSupportedException::typeinfo,
                NotSupportedException::~NotSupportedException);
  case HierarchicalValue:
    std::operator<<((ostream *)&this->field_0x18,"!");
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(local_f0,this);
    break;
  case UnaryOp:
    std::operator<<((ostream *)&this->field_0x18,"++");
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(local_f0,this);
    break;
  case BinaryOp:
    std::operator<<((ostream *)&this->field_0x18,"--");
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(local_f0,this);
    break;
  case ConditionalOp:
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(local_f0,this);
    std::operator<<((ostream *)&this->field_0x18,"++");
    break;
  case Inside:
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(local_f0,this);
    std::operator<<((ostream *)&this->field_0x18,"--");
  }
  return;
}

Assistant:

void handle(const slang::ast::UnaryExpression &expr) {
        auto const &op = expr.operand();
        ss_ << "(";
        // simple ones that have C++ operator overloaded
        switch (expr.op) {
            case slang::ast::UnaryOperator::Minus:
                ss_ << "-";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Plus:
                ss_ << "+";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Predecrement:
                ss_ << "--";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Preincrement:
                ss_ << "++";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::LogicalNot:
                ss_ << "!";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::BitwiseNot:
                ss_ << "~";
                op.visit(*this);
                break;
            case slang::ast::UnaryOperator::Postdecrement:
                op.visit(*this);
                ss_ << "--";
                break;
            case slang::ast::UnaryOperator::Postincrement:
                op.visit(*this);
                ss_ << "++";
                break;
            default:
                throw NotSupportedException(fmt::format("Unary type {0} not supported for hgdb",
                                                        slang::ast::toString(expr.op)),
                                            loc_);
        }
    }